

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reservoir_quantile.cpp
# Opt level: O1

void duckdb::ReservoirQuantileOperation::Destroy<duckdb::ReservoirQuantileState<float>>
               (ReservoirQuantileState<float> *state,AggregateInputData *aggr_input_data)

{
  BaseReservoirSampling *this;
  pointer ppVar1;
  
  if (state->v != (float *)0x0) {
    free(state->v);
    state->v = (float *)0x0;
  }
  this = state->r_samp;
  if (this != (BaseReservoirSampling *)0x0) {
    ppVar1 = (this->reservoir_weights).c.
             super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (ppVar1 != (pointer)0x0) {
      operator_delete(ppVar1);
    }
    RandomEngine::~RandomEngine((RandomEngine *)this);
    operator_delete(this);
    state->r_samp = (BaseReservoirSampling *)0x0;
  }
  return;
}

Assistant:

static void Destroy(STATE &state, AggregateInputData &aggr_input_data) {
		if (state.v) {
			free(state.v);
			state.v = nullptr;
		}
		if (state.r_samp) {
			delete state.r_samp;
			state.r_samp = nullptr;
		}
	}